

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

int xmlFdWrite(void *context,char *buffer,int len)

{
  int __fd;
  bool bVar1;
  uint uVar2;
  xmlParserErrors xVar3;
  ssize_t sVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  
  if (len < 1) {
    iVar6 = 0;
  }
  else {
    __fd = *context;
    iVar6 = 0;
    do {
      sVar4 = write(__fd,buffer,(ulong)(uint)len);
      uVar2 = (uint)sVar4;
      if ((int)uVar2 < 0) {
        piVar5 = __errno_location();
        xVar3 = xmlIOErr(*piVar5);
        return -xVar3;
      }
      iVar6 = iVar6 + uVar2;
      buffer = buffer + (uVar2 & 0x7fffffff);
      uVar7 = len - uVar2;
      bVar1 = (int)uVar2 <= len;
      len = uVar7;
    } while (uVar7 != 0 && bVar1);
  }
  return iVar6;
}

Assistant:

static int
xmlFdWrite(void *context, const char *buffer, int len) {
    xmlFdIOCtxt *fdctxt = context;
    int fd = fdctxt->fd;
    int ret = 0;
    int bytes;

    while (len > 0) {
	bytes = write(fd, buffer, len);
	if (bytes < 0)
            return(-xmlIOErr(errno));
        ret += bytes;
        buffer += bytes;
        len -= bytes;
    }

    return(ret);
}